

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpapiex.c
# Opt level: O1

HTTPAPIEX_RESULT
HTTPAPIEX_ExecuteRequest
          (HTTPAPIEX_HANDLE handle,HTTPAPI_REQUEST_TYPE requestType,char *relativePath,
          HTTP_HEADERS_HANDLE requestHttpHeadersHandle,BUFFER_HANDLE requestContent,uint *statusCode
          ,HTTP_HEADERS_HANDLE responseHttpHeadersHandle,BUFFER_HANDLE responseContent)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  HTTP_HEADERS_RESULT HVar4;
  HTTPAPI_RESULT HVar5;
  size_t sVar6;
  char *pcVar7;
  HTTP_HANDLE pHVar8;
  undefined8 *puVar9;
  uchar *content;
  long lVar10;
  LOGGER_LOG p_Var11;
  int iVar12;
  int iVar13;
  HTTPAPIEX_RESULT HVar14;
  size_t index;
  undefined8 uVar15;
  byte local_9c;
  byte local_8c;
  HTTP_HEADERS_HANDLE local_88;
  BUFFER_HANDLE local_80;
  HTTP_HEADERS_HANDLE local_78;
  BUFFER_HANDLE local_70;
  _Bool st [3];
  uint *local_48;
  char *local_40;
  
  if (handle == (HTTPAPIEX_HANDLE)0x0) {
    p_Var11 = xlogging_get_log_function();
    if (p_Var11 == (LOGGER_LOG)0x0) {
      return HTTPAPIEX_INVALID_ARG;
    }
    iVar12 = 0x175;
  }
  else {
    if (requestType - HTTPAPI_REQUEST_GET < 6) {
      local_9c = 1;
      local_80 = requestContent;
      if (requestContent == (BUFFER_HANDLE)0x0) {
        local_80 = BUFFER_new();
        if (local_80 != (BUFFER_HANDLE)0x0) {
          local_9c = 0;
          goto LAB_0012b281;
        }
        p_Var11 = xlogging_get_log_function();
        if (p_Var11 == (LOGGER_LOG)0x0) {
          local_9c = 0;
          local_8c = local_9c;
          bVar2 = local_9c;
          bVar3 = local_9c;
        }
        else {
          local_9c = (*p_Var11)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/httpapiex.c"
                                ,"buildAllRequests",0xfd,1,"unable to build the request content");
          local_8c = local_9c;
          bVar2 = local_9c;
          bVar3 = local_9c;
        }
LAB_0012b4ef:
        bVar1 = false;
      }
      else {
LAB_0012b281:
        local_88 = requestHttpHeadersHandle;
        if (requestHttpHeadersHandle == (HTTP_HEADERS_HANDLE)0x0) {
          local_88 = HTTPHeaders_Alloc();
        }
        local_8c = requestHttpHeadersHandle != (HTTP_HEADERS_HANDLE)0x0;
        if (local_88 == (HTTP_HEADERS_HANDLE)0x0) {
          p_Var11 = xlogging_get_log_function();
          if (p_Var11 != (LOGGER_LOG)0x0) {
            (*p_Var11)(AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/httpapiex.c"
                       ,"buildRequestHttpHeadersHandle",0x96,1,"unable to HTTPHeaders_Alloc");
          }
LAB_0012b4a4:
          if (requestContent == (BUFFER_HANDLE)0x0) {
            BUFFER_delete(local_80);
          }
          p_Var11 = xlogging_get_log_function();
          if (p_Var11 == (LOGGER_LOG)0x0) {
            bVar2 = 0;
            bVar3 = 0;
          }
          else {
            bVar2 = (*p_Var11)(AZ_LOG_ERROR,
                               "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/httpapiex.c"
                               ,"buildAllRequests",0x109,1,
                               "unable to build the request http headers handle");
            bVar3 = bVar2;
          }
          goto LAB_0012b4ef;
        }
        _st = 0;
        sVar6 = BUFFER_length(local_80);
        size_tToString(st,0x16,sVar6);
        pcVar7 = STRING_c_str(handle->hostName);
        HVar4 = HTTPHeaders_ReplaceHeaderNameValuePair(local_88,"Host",pcVar7);
        if ((HVar4 != HTTP_HEADERS_OK) ||
           (HVar4 = HTTPHeaders_ReplaceHeaderNameValuePair(local_88,"Content-Length",st),
           HVar4 != HTTP_HEADERS_OK)) {
          if (!(bool)local_8c) {
            HTTPHeaders_Free(local_88);
          }
          local_88 = (HTTP_HEADERS_HANDLE)0x0;
          goto LAB_0012b4a4;
        }
        local_40 = "";
        if (relativePath != (char *)0x0) {
          local_40 = relativePath;
        }
        local_48 = &dummyStatusCode;
        if (statusCode != (uint *)0x0) {
          local_48 = statusCode;
        }
        local_78 = responseHttpHeadersHandle;
        bVar2 = 1;
        if (responseHttpHeadersHandle == (HTTP_HEADERS_HANDLE)0x0) {
          local_78 = HTTPHeaders_Alloc();
          if (local_78 == (HTTP_HEADERS_HANDLE)0x0) {
            if (requestContent == (BUFFER_HANDLE)0x0) {
              BUFFER_delete(local_80);
            }
            if (requestHttpHeadersHandle == (HTTP_HEADERS_HANDLE)0x0) {
              HTTPHeaders_Free(local_88);
              local_88 = (HTTP_HEADERS_HANDLE)0x0;
            }
            p_Var11 = xlogging_get_log_function();
            if (p_Var11 == (LOGGER_LOG)0x0) {
              bVar2 = 0;
              bVar3 = 0;
            }
            else {
              bVar2 = (*p_Var11)(AZ_LOG_ERROR,
                                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/httpapiex.c"
                                 ,"buildAllRequests",0x131,1,"unable to build response content");
              bVar3 = bVar2;
            }
            goto LAB_0012b4ef;
          }
          bVar2 = 0;
        }
        local_70 = responseContent;
        if (responseContent == (BUFFER_HANDLE)0x0) {
          local_70 = BUFFER_new();
          if (local_70 == (BUFFER_HANDLE)0x0) {
            if (requestContent == (BUFFER_HANDLE)0x0) {
              BUFFER_delete(local_80);
              local_80 = (BUFFER_HANDLE)0x0;
            }
            if (requestHttpHeadersHandle == (HTTP_HEADERS_HANDLE)0x0) {
              HTTPHeaders_Free(local_88);
              local_88 = (HTTP_HEADERS_HANDLE)0x0;
            }
            if (responseHttpHeadersHandle == (HTTP_HEADERS_HANDLE)0x0) {
              HTTPHeaders_Free(local_78);
              local_78 = (HTTP_HEADERS_HANDLE)0x0;
            }
            p_Var11 = xlogging_get_log_function();
            if (p_Var11 == (LOGGER_LOG)0x0) {
              bVar3 = 0;
            }
            else {
              bVar3 = (*p_Var11)(AZ_LOG_ERROR,
                                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/httpapiex.c"
                                 ,"buildAllRequests",0x14a,1,"unable to build response content");
            }
            goto LAB_0012b4ef;
          }
          bVar3 = 1;
        }
        else {
          bVar3 = 0;
        }
        bVar1 = true;
      }
      if (bVar1) {
        _st = _st & 0xffffffffff000000;
        if (handle->k == -1) {
          handle->k = 0;
        }
        do {
          iVar12 = handle->k;
          iVar13 = 8;
          if ((long)iVar12 < 3) {
            if (st[iVar12] == false) {
              if (iVar12 == 2) {
                sVar6 = BUFFER_length(local_80);
                content = BUFFER_u_char(local_80);
                HVar5 = HTTPAPI_ExecuteRequest
                                  (handle->httpHandle,requestType,local_40,local_88,content,sVar6,
                                   local_48,local_78,local_70);
LAB_0012b692:
                if (HVar5 == HTTPAPI_OK) goto LAB_0012b69b;
              }
              else if (iVar12 == 1) {
                pcVar7 = STRING_c_str(handle->hostName);
                pHVar8 = HTTPAPI_CreateConnection(pcVar7);
                handle->httpHandle = pHVar8;
                if (pHVar8 != (HTTP_HANDLE)0x0) {
                  sVar6 = VECTOR_size(handle->savedOptions);
                  if (sVar6 != 0) {
                    index = 0;
                    do {
                      puVar9 = (undefined8 *)VECTOR_element(handle->savedOptions,index);
                      HVar5 = HTTPAPI_SetOption(handle->httpHandle,(char *)*puVar9,(void *)puVar9[1]
                                               );
                      if ((HVar5 != HTTPAPI_OK) &&
                         (p_Var11 = xlogging_get_log_function(), p_Var11 != (LOGGER_LOG)0x0)) {
                        (*p_Var11)(AZ_LOG_ERROR,
                                   "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/httpapiex.c"
                                   ,"HTTPAPIEX_ExecuteRequest",0x1d8,1,
                                   "HTTPAPI_SetOption failed when called for option %s",*puVar9);
                      }
                      index = index + 1;
                    } while (sVar6 != index);
                  }
                  goto LAB_0012b69b;
                }
              }
              else if (iVar12 == 0) {
                if (useGlobalInitialization < 1) {
                  HVar5 = HTTPAPI_Init();
                  goto LAB_0012b692;
                }
LAB_0012b69b:
                iVar12 = handle->k;
                lVar10 = (long)iVar12;
                iVar13 = 0x10;
                if (lVar10 != 2) {
                  st[lVar10] = true;
                  handle->k = iVar12 + 1;
                  st[lVar10 + 1] = false;
                  iVar13 = 0;
                }
                goto LAB_0012b6be;
              }
            }
            iVar12 = handle->k;
            iVar13 = 0;
            st[iVar12] = false;
            handle->k = iVar12 + -1;
            if ((long)iVar12 == 2) {
              HTTPAPI_CloseConnection(handle->httpHandle);
              handle->httpHandle = (HTTP_HANDLE)0x0;
            }
            else if ((iVar12 == 1) && (useGlobalInitialization == 0)) {
              HTTPAPI_Deinit();
            }
          }
LAB_0012b6be:
          if (iVar13 != 0) {
            if (iVar13 != 8) {
              HVar14 = HTTPAPIEX_OK;
              goto LAB_0012b76b;
            }
            goto LAB_0012b72b;
          }
          if (handle->k < 0) {
LAB_0012b72b:
            p_Var11 = xlogging_get_log_function();
            HVar14 = HTTPAPIEX_RECOVERYFAILED;
            if (p_Var11 != (LOGGER_LOG)0x0) {
              (*p_Var11)(AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/httpapiex.c"
                         ,"HTTPAPIEX_ExecuteRequest",0x227,1,
                         "unable to recover sending to a working state");
            }
LAB_0012b76b:
            if (local_9c == 0) {
              BUFFER_delete(local_80);
            }
            if (local_8c == 0) {
              HTTPHeaders_Free(local_88);
            }
            if ((bVar3 & 1) != 0) {
              BUFFER_delete(local_70);
            }
            if (bVar2 != 0) {
              return HVar14;
            }
            HTTPHeaders_Free(local_78);
            return HVar14;
          }
        } while( true );
      }
      p_Var11 = xlogging_get_log_function();
      HVar14 = HTTPAPIEX_ERROR;
      if (p_Var11 == (LOGGER_LOG)0x0) {
        return HTTPAPIEX_ERROR;
      }
      iVar12 = 0x194;
      uVar15 = 2;
      pcVar7 = HTTPAPIEX_RESULTStringStorage[2];
      goto LAB_0012b436;
    }
    p_Var11 = xlogging_get_log_function();
    if (p_Var11 == (LOGGER_LOG)0x0) {
      return HTTPAPIEX_INVALID_ARG;
    }
    iVar12 = 0x17d;
  }
  HVar14 = HTTPAPIEX_INVALID_ARG;
  uVar15 = 3;
  pcVar7 = HTTPAPIEX_RESULTStringStorage[3];
LAB_0012b436:
  (*p_Var11)(AZ_LOG_ERROR,
             "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/httpapiex.c"
             ,"HTTPAPIEX_ExecuteRequest",iVar12,1,"error code = %s%s (%d)","",pcVar7,uVar15);
  return HVar14;
}

Assistant:

HTTPAPIEX_RESULT HTTPAPIEX_ExecuteRequest(HTTPAPIEX_HANDLE handle, HTTPAPI_REQUEST_TYPE requestType, const char* relativePath,
    HTTP_HEADERS_HANDLE requestHttpHeadersHandle, BUFFER_HANDLE requestContent, unsigned int* statusCode,
    HTTP_HEADERS_HANDLE responseHttpHeadersHandle, BUFFER_HANDLE responseContent)
{
    HTTPAPIEX_RESULT result;
    /*Codes_SRS_HTTPAPIEX_02_006: [If parameter handle is NULL then HTTPAPIEX_ExecuteRequest shall fail and return HTTPAPIEX_INVALID_ARG.]*/
    if (handle == NULL)
    {
        result = HTTPAPIEX_INVALID_ARG;
        LOG_HTTAPIEX_ERROR();
    }
    else
    {
        /*Codes_SRS_HTTPAPIEX_02_007: [If parameter requestType does not indicate a valid request, HTTPAPIEX_ExecuteRequest shall fail and return HTTPAPIEX_INVALID_ARG.] */
        if (!validRequestType(requestType))
        {
            result = HTTPAPIEX_INVALID_ARG;
            LOG_HTTAPIEX_ERROR();
        }
        else
        {
            HTTPAPIEX_HANDLE_DATA *handleData = (HTTPAPIEX_HANDLE_DATA *)handle;

            /*call to buildAll*/
            const char* toBeUsedRelativePath;
            HTTP_HEADERS_HANDLE toBeUsedRequestHttpHeadersHandle; bool isOriginalRequestHttpHeadersHandle;
            BUFFER_HANDLE toBeUsedRequestContent; bool isOriginalRequestContent;
            unsigned int* toBeUsedStatusCode;
            HTTP_HEADERS_HANDLE toBeUsedResponseHttpHeadersHandle; bool isOriginalResponseHttpHeadersHandle;
            BUFFER_HANDLE toBeUsedResponseContent;  bool isOriginalResponseContent;

            if (buildAllRequests(handleData, requestType, relativePath, requestHttpHeadersHandle, requestContent, statusCode, responseHttpHeadersHandle, responseContent,
                &toBeUsedRelativePath,
                &toBeUsedRequestHttpHeadersHandle, &isOriginalRequestHttpHeadersHandle,
                &toBeUsedRequestContent, &isOriginalRequestContent,
                &toBeUsedStatusCode,
                &toBeUsedResponseHttpHeadersHandle, &isOriginalResponseHttpHeadersHandle,
                &toBeUsedResponseContent, &isOriginalResponseContent) != 0)
            {
                result = HTTPAPIEX_ERROR;
                LOG_HTTAPIEX_ERROR();
            }
            else
            {

                /*Codes_SRS_HTTPAPIEX_02_023: [HTTPAPIEX_ExecuteRequest shall try to execute the HTTP call by ensuring the following API call sequence is respected:]*/
                /*Codes_SRS_HTTPAPIEX_02_024: [If any point in the sequence fails, HTTPAPIEX_ExecuteRequest shall attempt to recover by going back to the previous step and retrying that step.]*/
                /*Codes_SRS_HTTPAPIEX_02_025: [If the first step fails, then the sequence fails.]*/
                /*Codes_SRS_HTTPAPIEX_02_026: [A step shall be retried at most once.]*/
                /*Codes_SRS_HTTPAPIEX_02_027: [If a step has been retried then all subsequent steps shall be retried too.]*/
                bool st[3] = { false, false, false }; /*the three levels of possible failure in resilient send: HTTAPI_Init, HTTPAPI_CreateConnection, HTTPAPI_ExecuteRequest*/
                if (handleData->k == -1)
                {
                    handleData->k = 0;
                }

                do
                {
                    bool goOn;

                    if (handleData->k > 2)
                    {
                        /* error */
                        break;
                    }

                    if (st[handleData->k] == true) /*already been tried*/
                    {
                        goOn = false;
                    }
                    else
                    {
                        switch (handleData->k)
                        {
                        case 0:
                        {
                            if (useGlobalInitialization > 0)
                            {
                                /*Codes_SRS_HTTPAPIEX_21_048: [If HTTPAPIEX_Init was called, HTTPAPI_ExecuteRequest shall not call HTTPAPI_Init.] */
                                goOn = true;
                            }
                            else if (HTTPAPI_Init() != HTTPAPI_OK)
                            {
                                goOn = false;
                            }
                            else
                            {
                                goOn = true;
                            }
                            break;
                        }
                        case 1:
                        {
                            if ((handleData->httpHandle = HTTPAPI_CreateConnection(STRING_c_str(handleData->hostName))) == NULL)
                            {
                                goOn = false;
                            }
                            else
                            {
                                size_t i;
                                size_t vectorSize = VECTOR_size(handleData->savedOptions);
                                for (i = 0; i < vectorSize; i++)
                                {
                                    /*Codes_SRS_HTTPAPIEX_02_035: [HTTPAPIEX_ExecuteRequest shall pass all the saved options (see HTTPAPIEX_SetOption) to the newly create HTTPAPI_HANDLE in step 2 by calling HTTPAPI_SetOption.]*/
                                    /*Codes_SRS_HTTPAPIEX_02_036: [If setting the option fails, then the failure shall be ignored.] */
                                    HTTPAPIEX_SAVED_OPTION* option = (HTTPAPIEX_SAVED_OPTION*)VECTOR_element(handleData->savedOptions, i);
                                    if (HTTPAPI_SetOption(handleData->httpHandle, option->optionName, option->value) != HTTPAPI_OK)
                                    {
                                        LogError("HTTPAPI_SetOption failed when called for option %s", option->optionName);
                                    }
                                }
                                goOn = true;
                            }
                            break;
                        }
                        case 2:
                        {
                            size_t length = BUFFER_length(toBeUsedRequestContent);
                            unsigned char* buffer = BUFFER_u_char(toBeUsedRequestContent);
                            if (HTTPAPI_ExecuteRequest(handleData->httpHandle, requestType, toBeUsedRelativePath, toBeUsedRequestHttpHeadersHandle, buffer, length, toBeUsedStatusCode, toBeUsedResponseHttpHeadersHandle, toBeUsedResponseContent) != HTTPAPI_OK)
                            {
                                goOn = false;
                            }
                            else
                            {
                                goOn = true;
                            }
                            break;
                        }
                        default:
                        {
                            /*serious error*/
                            goOn = false;
                            break;
                        }
                        }
                    }

                    if (goOn)
                    {
                        if (handleData->k == 2)
                        {
                            /*Codes_SRS_HTTPAPIEX_02_028: [HTTPAPIEX_ExecuteRequest shall return HTTPAPIEX_OK when a call to HTTPAPI_ExecuteRequest has been completed successfully.]*/
                            result = HTTPAPIEX_OK;
                            goto out;
                        }
                        else
                        {
                            st[handleData->k] = true;
                            handleData->k++;
                            st[handleData->k] = false;
                        }
                    }
                    else
                    {
                        st[handleData->k] = false;
                        handleData->k--;
                        switch (handleData->k)
                        {
                        case 0:
                        {
                            /*Codes_SRS_HTTPAPIEX_21_049: [If HTTPAPIEX_Init was called, HTTPAPI_ExecuteRequest shall not call HTTPAPI_Deinit.] */
                            if (useGlobalInitialization == 0)
                            {
                                HTTPAPI_Deinit();
                            }
                            break;
                        }
                        case 1:
                        {
                            HTTPAPI_CloseConnection(handleData->httpHandle);
                            handleData->httpHandle = NULL;
                            break;
                        }
                        case 2:
                        {
                            break;
                        }
                        default:
                        {
                            break;
                        }
                        }
                    }
                } while (handleData->k >= 0);
                /*Codes_SRS_HTTPAPIEX_02_029: [Otherwise, HTTAPIEX_ExecuteRequest shall return HTTPAPIEX_RECOVERYFAILED.] */
                result = HTTPAPIEX_RECOVERYFAILED;
                LogError("unable to recover sending to a working state");
            out:;
                /*in all cases, unbuild the temporaries*/
                if (isOriginalRequestContent == false)
                {
                    BUFFER_delete(toBeUsedRequestContent);
                    toBeUsedRequestContent = NULL;
                }
                if (isOriginalRequestHttpHeadersHandle == false)
                {
                    HTTPHeaders_Free(toBeUsedRequestHttpHeadersHandle);
                    toBeUsedRequestHttpHeadersHandle = NULL;
                }
                if (isOriginalResponseContent == false)
                {
                    BUFFER_delete(toBeUsedResponseContent);
                    toBeUsedResponseContent = NULL;
                }
                if (isOriginalResponseHttpHeadersHandle == false)
                {
                    HTTPHeaders_Free(toBeUsedResponseHttpHeadersHandle);
                    toBeUsedResponseHttpHeadersHandle = NULL;
                }
            }
        }
    }
    return result;
}